

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O3

bool __thiscall Refal2::CRuleParser::BeginFunction(CRuleParser *this)

{
  CToken *nameToken;
  int iVar1;
  int iVar2;
  TNumber TVar3;
  TLabel TVar4;
  
  if (((this->super_CQualifierParser).token.type == TT_Word) &&
     ((this->super_CQualifierParser).token.word._M_string_length != 0)) {
    nameToken = &(this->super_CQualifierParser).token;
    TVar4 = CModuleBuilder::Declare((CModuleBuilder *)this,nameToken);
    if (TVar4 != -1) {
      iVar1 = nameToken->line;
      iVar2 = (this->super_CQualifierParser).token.position;
      TVar3 = (this->super_CQualifierParser).token.number;
      (this->functionName).type = nameToken->type;
      (this->functionName).line = iVar1;
      (this->functionName).position = iVar2;
      (this->functionName).number = TVar3;
      std::__cxx11::string::_M_assign((string *)&(this->functionName).word);
      (this->super_CQualifierParser).super_CParsingElementState.state = PES_NotFinished;
      if ((this->functionName).type == TT_None) {
        __assert_fail("!functionName.IsNone()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/RuleParser.cpp"
                      ,0x47,"void Refal2::CRuleParser::beginRule()");
      }
      this->state = (TState)direction;
      *(undefined8 *)&this->field_0x1e80 = 0;
    }
    return TVar4 != -1;
  }
  __assert_fail("token.type == TT_Word && !token.word.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/RuleParser.cpp"
                ,0x19,"bool Refal2::CRuleParser::BeginFunction()");
}

Assistant:

bool CRuleParser::BeginFunction()
{
	assert( token.type == TT_Word && !token.word.empty() );
	if( CModuleBuilder::Declare( token ) != InvalidDictionaryIndex ) {
		functionName = token;
		beginRule();
		return true;
	}
	return false;
}